

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QPersistentModelIndex,_QHashDummyValue>::findImpl<QPersistentModelIndex>
          (QHash<QPersistentModelIndex,_QHashDummyValue> *this,QPersistentModelIndex *key)

{
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar1;
  Data *pDVar2;
  ulong uVar3;
  Data *pDVar4;
  Bucket BVar5;
  iterator iVar6;
  
  pDVar1 = this->d;
  if ((pDVar1 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) ||
     (pDVar1->size == 0)) {
    pDVar2 = (Data *)0x0;
    pDVar4 = (Data *)0x0;
  }
  else {
    uVar3 = ((ulong)key->d >> 0x20 ^ (ulong)key->d) * -0x2917014799a6026d;
    uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
    BVar5 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
            findBucketWithHash<QPersistentModelIndex>
                      (pDVar1,key,uVar3 >> 0x20 ^ pDVar1->seed ^ uVar3);
    pDVar1 = this->d;
    pDVar4 = (Data *)(((ulong)((long)BVar5.span - (long)pDVar1->spans) >> 4) * 0x1c71c71c71c71c80 |
                     BVar5.index);
    if ((pDVar1 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) ||
       (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
               detached(pDVar1);
      this->d = pDVar1;
    }
    pDVar2 = this->d;
    if (this->d->spans[(ulong)pDVar4 >> 7].offsets[(uint)BVar5.index & 0x7f] == 0xff) {
      pDVar2 = (Data *)0x0;
      pDVar4 = (Data *)0x0;
    }
  }
  iVar6.i.bucket = (size_t)pDVar4;
  iVar6.i.d = pDVar2;
  return (iterator)iVar6.i;
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }